

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::Matchers::StdString::RegexMatcher::describe_abi_cxx11_
          (string *__return_storage_ptr__,RegexMatcher *this)

{
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  StringMaker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::convert(&local_38,&this->m_regex);
  std::operator+(&bStack_58,"matches ",&local_38);
  __rhs = " case insensitively";
  if (this->m_caseSensitivity == Yes) {
    __rhs = " case sensitively";
  }
  std::operator+(__return_storage_ptr__,&bStack_58,__rhs);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string RegexMatcher::describe() const {
            return "matches " + ::Catch::Detail::stringify(m_regex) + ((m_caseSensitivity == CaseSensitive::Choice::Yes)? " case sensitively" : " case insensitively");
        }